

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O2

ParsedSchema __thiscall
capnp::SchemaParser::parseDiskFile
          (SchemaParser *this,StringPtr displayName,StringPtr diskPath,
          ArrayPtr<const_kj::StringPtr> importPath)

{
  map<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
  *this_00;
  long *plVar1;
  PathPtr prefix;
  bool bVar2;
  int iVar3;
  DiskFileCompat *pDVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar5;
  iterator iVar6;
  Clock *clock;
  InMemoryFileFactory *fileFactory;
  StringPtr *extraout_RDX;
  StringPtr *extraout_RDX_00;
  StringPtr *params;
  StringPtr *extraout_RDX_01;
  StringPtr *extraout_RDX_02;
  StringPtr *extraout_RDX_03;
  StringPtr *params_00;
  _Base_ptr p_Var7;
  Maybe<kj::String> *displayNameOverride;
  _Base_ptr *pp_Var8;
  void *__arg;
  ArrayPtr<const_char> *this_01;
  _Rb_tree_header *p_Var9;
  long lVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_bool>
  pVar11;
  ParsedSchema PVar12;
  ArrayPtr<const_kj::ReadableDirectory_*const> importPath_00;
  Path parsed;
  StringPtr pathRef;
  DebugComparison<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_&,_std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
  _kjCondition_1;
  Path path;
  iterator iter;
  StringPtr importDir;
  Array<const_kj::ReadableDirectory_*> result;
  Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> lock;
  PathPtr cwd;
  pair<const_kj::StringPtr_*,_unsigned_long> importPathKey;
  DebugExpression<bool> local_209;
  Own<const_kj::ReadableDirectory,_std::nullptr_t> local_208;
  mapped_type *local_1f0;
  Path *local_1e8;
  _Base_ptr local_1e0;
  Array<kj::String> local_1d8;
  Own<kj::Directory,_std::nullptr_t> local_1b8;
  undefined1 local_1a8 [32];
  ArrayDisposer *pAStack_188;
  String *local_180;
  size_t sStack_178;
  ArrayDisposer *local_170;
  Disposer *local_168;
  _Base_ptr local_160;
  Array<kj::String> local_158;
  undefined1 local_138 [40];
  DiskFileCompat *local_110;
  ImportDir local_108;
  SchemaParser *local_c8;
  Array<const_kj::ReadableDirectory_*> local_c0;
  Array<kj::String> local_a8;
  undefined1 local_90 [16];
  Maybe<kj::_::Mutex::Waiter_&> *local_80;
  size_t local_78;
  undefined1 local_70 [48];
  key_type local_40;
  
  __arg = (void *)diskPath.content.size_;
  local_78 = displayName.content.size_;
  local_80 = (Maybe<kj::_::Mutex::Waiter_&> *)displayName.content.ptr;
  local_c8 = this;
  kj::MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *)local_90,
             &((this->impl).ptr)->compat);
  if (*(bool *)&((Maybe<kj::_::Mutex::Waiter_&> *)local_90._8_8_)->ptr == false) {
    pDVar4 = kj::_::NullableValue<capnp::SchemaParser::DiskFileCompat>::emplace<>
                       ((NullableValue<capnp::SchemaParser::DiskFileCompat> *)local_90._8_8_);
  }
  else {
    pDVar4 = (DiskFileCompat *)(local_90._8_8_ + 8);
  }
  iVar3 = (**pDVar4->fs->_vptr_Filesystem)();
  local_1e8 = (Path *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*pDVar4->fs->_vptr_Filesystem[2])();
  local_70._0_8_ = CONCAT44(extraout_var_00,iVar3);
  kj::PathPtr::eval((Path *)&local_158,(PathPtr *)local_70,diskPath);
  if (importPath.size_ == 0) {
    params_00 = extraout_RDX;
    displayNameOverride = (Maybe<kj::String> *)0x0;
    pmVar5 = (mapped_type *)(ReadableDirectory **)0x0;
  }
  else {
    local_40.first = importPath.ptr;
    local_40.second = importPath.size_;
    pmVar5 = std::
             map<std::pair<const_kj::StringPtr_*,_unsigned_long>,_kj::Array<const_kj::ReadableDirectory_*>,_std::less<std::pair<const_kj::StringPtr_*,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<const_kj::StringPtr_*,_unsigned_long>,_kj::Array<const_kj::ReadableDirectory_*>_>_>_>
             ::operator[](&pDVar4->cachedImportPaths,&local_40);
    local_138._32_8_ = pmVar5->size_;
    params_00 = extraout_RDX_00;
    local_110 = pDVar4;
    if ((Maybe<kj::String> *)local_138._32_8_ == (Maybe<kj::String> *)0x0) {
      local_1f0 = pmVar5;
      local_138._8_8_ =
           kj::_::HeapArrayDisposer::allocateUninitialized<kj::ReadableDirectory_const*>
                     (importPath.size_);
      local_138._16_8_ = (long)&((_Base_ptr)local_138._8_8_)->_M_color + importPath.size_ * 8;
      local_138._24_8_ = &kj::_::HeapArrayDisposer::instance;
      this_00 = &local_110->cachedImportDirs;
      local_1e0 = &(local_110->cachedImportDirs)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_138._0_8_ = local_138._8_8_;
      for (this_01 = &(importPath.ptr)->content;
          this_01 != &importPath.ptr[importPath.size_].content; this_01 = this_01 + 1) {
        iVar6 = std::
                _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                ::find(&this_00->_M_t,(key_type *)this_01);
        if (iVar6._M_node == local_1e0) {
          kj::PathPtr::eval((Path *)&local_1d8,(PathPtr *)local_70,(StringPtr)*this_01);
          local_208.disposer = (Disposer *)0x0;
          local_208.ptr = (ReadableDirectory *)0x0;
          (*(code *)(local_1e8->parts).ptr[3].content.disposer)
                    (&local_108,local_1e8,local_1d8.ptr,local_1d8.size_);
          local_1a8._0_8_ = local_108.pathStr.content.ptr;
          local_1a8._8_8_ = local_108.pathStr.content.size_;
          local_108.pathStr.content.size_ = 0;
          kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>::dispose
                    ((Own<const_kj::ReadableDirectory,_std::nullptr_t> *)&local_108);
          if ((_Base_ptr)local_1a8._8_8_ == (_Base_ptr)0x0) {
            clock = kj::nullClock();
            fileFactory = kj::defaultInMemoryFileFactory();
            kj::newInMemoryDirectory((kj *)&local_1b8,clock,fileFactory);
            local_108.pathStr.content.ptr = (char *)local_1b8.disposer;
            local_108.pathStr.content.size_ = (size_t)local_1b8.ptr;
            local_1b8.ptr = (Directory *)0x0;
            kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>::operator=
                      (&local_208,(Own<const_kj::ReadableDirectory,_std::nullptr_t> *)&local_108);
            kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>::dispose
                      ((Own<const_kj::ReadableDirectory,_std::nullptr_t> *)&local_108);
            kj::Own<kj::Directory,_std::nullptr_t>::dispose(&local_1b8);
          }
          else {
            kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>::operator=
                      (&local_208,(Own<const_kj::ReadableDirectory,_std::nullptr_t> *)local_1a8);
          }
          kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>::dispose
                    ((Own<const_kj::ReadableDirectory,_std::nullptr_t> *)local_1a8);
          p_Var7 = (_Base_ptr)local_208.ptr;
          local_1b8.disposer = (Disposer *)this_01->ptr;
          local_1b8.ptr = (Directory *)this_01->size_;
          kj::str<kj::StringPtr_const&>(&local_108.pathStr,(kj *)this_01,params);
          sStack_178 = local_1d8.size_;
          local_180 = local_1d8.ptr;
          local_160 = (_Base_ptr)local_208.ptr;
          local_108.path.parts.disposer = local_1d8.disposer;
          local_1d8.ptr = (String *)0x0;
          local_1d8.size_ = 0;
          local_208.ptr = (ReadableDirectory *)0x0;
          local_108.dir.disposer = local_208.disposer;
          local_1a8._0_8_ = local_1b8.disposer;
          local_1a8._8_8_ = local_1b8.ptr;
          local_1a8._16_8_ = local_108.pathStr.content.ptr;
          local_1a8._24_8_ = local_108.pathStr.content.size_;
          pAStack_188 = local_108.pathStr.content.disposer;
          local_108.pathStr.content.ptr = (char *)0x0;
          local_108.pathStr.content.size_ = 0;
          local_170 = local_1d8.disposer;
          local_108.path.parts.ptr = (String *)0x0;
          local_108.path.parts.size_ = 0;
          local_168 = local_208.disposer;
          local_108.dir.ptr = (ReadableDirectory *)0x0;
          pVar11 = std::
                   _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
                   ::
                   _M_emplace_unique<std::pair<kj::StringPtr,capnp::SchemaParser::DiskFileCompat::ImportDir>>
                             ((_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
                               *)this_00,
                              (pair<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir> *
                              )local_1a8);
          local_209.value = pVar11.second;
          DiskFileCompat::ImportDir::~ImportDir((ImportDir *)(local_1a8 + 0x10));
          DiskFileCompat::ImportDir::~ImportDir(&local_108);
          if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                      ((Fault *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser.c++"
                       ,0xf6,FAILED,
                       "compat->cachedImportDirs.insert(std::make_pair(pathRef, DiskFileCompat::ImportDir { kj::str(path), kj::mv(parsed), kj::mv(dir) })).second"
                       ,"_kjCondition,",&local_209);
            kj::_::Debug::Fault::fatal((Fault *)local_1a8);
          }
          kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>::dispose(&local_208);
          kj::Array<kj::String>::~Array(&local_1d8);
        }
        else {
          p_Var7 = iVar6._M_node[3]._M_parent;
        }
        *(_Base_ptr *)local_138._8_8_ = p_Var7;
        local_138._8_8_ = local_138._8_8_ + 8;
      }
      local_c0.size_ = (long)(local_138._8_8_ - local_138._0_8_) >> 3;
      local_c0.ptr = (ReadableDirectory **)local_138._0_8_;
      local_c0.disposer = (ArrayDisposer *)local_138._24_8_;
      local_138._0_8_ = (_Base_ptr)0x0;
      local_138._8_8_ = (_Base_ptr)0x0;
      local_138._16_8_ = (_Base_ptr)0x0;
      kj::ArrayBuilder<const_kj::ReadableDirectory_*>::dispose
                ((ArrayBuilder<const_kj::ReadableDirectory_*> *)local_138);
      pmVar5 = local_1f0;
      kj::Array<const_kj::ReadableDirectory_*>::operator=(local_1f0,&local_c0);
      kj::Array<const_kj::ReadableDirectory_*>::~Array(&local_c0);
      local_138._32_8_ = pmVar5->size_;
      params_00 = extraout_RDX_01;
    }
    local_1f0 = (mapped_type *)pmVar5->ptr;
    local_1e0 = (_Base_ptr)&local_110->cachedImportDirs;
    p_Var9 = &(local_110->cachedImportDirs)._M_t._M_impl.super__Rb_tree_header;
    pp_Var8 = (_Base_ptr *)0x0;
    p_Var7 = (_Base_ptr)0x0;
    for (lVar10 = 0; importPath.size_ * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
      plVar1 = (long *)((long)&((importPath.ptr)->content).ptr + lVar10);
      local_108.pathStr.content.ptr = (char *)*plVar1;
      local_108.pathStr.content.size_ = plVar1[1];
      local_138._0_8_ =
           std::
           _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
           ::find((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                   *)local_1e0,(key_type *)&local_108);
      local_1a8._0_8_ = local_138;
      local_1a8._16_8_ = anon_var_dwarf_43885;
      local_1a8._24_8_ = &DAT_00000005;
      pAStack_188 = (ArrayDisposer *)
                    CONCAT71(pAStack_188._1_7_,(_Rb_tree_header *)local_138._0_8_ != p_Var9);
      local_1a8._8_8_ = p_Var9;
      if ((_Rb_tree_header *)local_138._0_8_ == p_Var9) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<std::_Rb_tree_iterator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>&,std::_Rb_tree_iterator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>&>
                  ((Fault *)&local_1d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser.c++"
                   ,0x104,FAILED,"iter != compat->cachedImportDirs.end()","_kjCondition,",
                   (DebugComparison<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_&,_std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                    *)local_1a8);
        kj::_::Debug::Fault::fatal((Fault *)&local_1d8);
      }
      prefix.parts.ptr = (String *)((_Rb_tree_node_base *)(local_138._0_8_ + 0x40))->_M_parent;
      prefix.parts.size_ = (size_t)((_Rb_tree_node_base *)(local_138._0_8_ + 0x40))->_M_left;
      bVar2 = kj::Path::startsWith((Path *)&local_158,prefix);
      if (bVar2) {
        if (p_Var7 < ((_Base_ptr)(local_138._0_8_ + 0x40))->_M_left) {
          p_Var7 = ((_Base_ptr)(local_138._0_8_ + 0x40))->_M_left;
          pp_Var8 = &((_Base_ptr)(local_138._0_8_ + 0x20))->_M_left;
        }
      }
      params_00 = extraout_RDX_02;
    }
    displayNameOverride = (Maybe<kj::String> *)local_138._32_8_;
    pmVar5 = local_1f0;
    if (pp_Var8 != (_Base_ptr *)0x0) {
      local_1e8 = (Path *)pp_Var8[7];
      local_108.pathStr.content.ptr = (char *)(local_158.ptr + (long)pp_Var8[4]);
      local_108.pathStr.content.size_ = local_158.size_ - (long)pp_Var8[4];
      kj::PathPtr::clone((PathPtr *)local_1a8,(__fn *)&local_108,local_108.pathStr.content.ptr,
                         (int)local_108.pathStr.content.size_,__arg);
      kj::Array<kj::String>::operator=(&local_158,(Array<kj::String> *)local_1a8);
      kj::Array<kj::String>::~Array((Array<kj::String> *)local_1a8);
      params_00 = extraout_RDX_03;
      displayNameOverride = (Maybe<kj::String> *)local_138._32_8_;
      pmVar5 = local_1f0;
    }
  }
  local_a8.ptr = local_158.ptr;
  local_a8.size_ = local_158.size_;
  local_a8.disposer = local_158.disposer;
  local_158.ptr = (String *)0x0;
  local_158.size_ = 0;
  kj::str<kj::StringPtr&>((String *)local_1a8,(kj *)&local_80,params_00);
  local_70[0x10] = 1;
  local_70._24_8_ = local_1a8._0_8_;
  local_70._32_8_ = local_1a8._8_8_;
  local_70._40_8_ = local_1a8._16_8_;
  local_1a8._0_8_ = (Exception *)0x0;
  local_1a8._8_8_ = (_Base_ptr)0x0;
  importPath_00.size_ = (size_t)pmVar5;
  importPath_00.ptr = (ReadableDirectory **)&local_a8;
  SchemaFile::newFromDirectory
            ((ReadableDirectory *)&local_108,local_1e8,importPath_00,displayNameOverride);
  PVar12 = parseFile(local_c8,(Own<capnp::SchemaFile,_std::nullptr_t> *)&local_108);
  kj::Own<capnp::SchemaFile,_std::nullptr_t>::dispose
            ((Own<capnp::SchemaFile,_std::nullptr_t> *)&local_108);
  kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)(local_70 + 0x10));
  kj::Array<char>::~Array((Array<char> *)local_1a8);
  kj::Array<kj::String>::~Array(&local_a8);
  kj::Array<kj::String>::~Array(&local_158);
  kj::Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::~Locked
            ((Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *)local_90);
  return PVar12;
}

Assistant:

ParsedSchema SchemaParser::parseDiskFile(
    kj::StringPtr displayName, kj::StringPtr diskPath,
    kj::ArrayPtr<const kj::StringPtr> importPath) const {
  auto lock = impl->compat.lockExclusive();
  DiskFileCompat* compat;
  KJ_IF_SOME(c, *lock) {
    compat = &c;
  } else {
    compat = &lock->emplace();
  }